

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupTestCase.cpp
# Opt level: O0

void __thiscall
SuiteGroupTests::TestremoveGroupByNum::~TestremoveGroupByNum(TestremoveGroupByNum *this)

{
  TestremoveGroupByNum *this_local;
  
  ~TestremoveGroupByNum(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(removeGroupByNum)
{
  Group parent(5, 100);

  Group childA(1, 10);
  childA.setField(1, "childA_1");
  childA.setField(2, "childA_2");
  parent.addGroup(childA);

  Group childB(1, 10);
  childB.setField(1, "childB_1");
  childB.setField(2, "childB_2");
  parent.addGroup(childB);

  parent.removeGroup(1, childA);

  CHECK_EQUAL(1, (int) parent.groupCount(1));

  Group actualChild(1, 10);
  parent.getGroup(1, actualChild);
  CHECK_EQUAL("childB_1", actualChild.getField(1));
  CHECK_EQUAL("childB_2", actualChild.getField(2));

}